

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  ushort uVar1;
  IRType IVar2;
  int iVar3;
  TRef TVar4;
  GCupval *uvp_00;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint in_EDX;
  uint in_ESI;
  jit_State *in_RDI;
  TRef res;
  IRType t;
  int32_t slot;
  TRef kfunc;
  TRef tr;
  int needbarrier;
  IRRef uref;
  TRef fn;
  GCupval *uvp;
  undefined4 in_stack_ffffffffffffff28;
  int32_t in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  IRType in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  int iVar8;
  IRRef1 IVar9;
  undefined4 in_stack_ffffffffffffff50;
  uint local_a0;
  TRef local_8c;
  uint local_4;
  
  uvp_00 = (GCupval *)(ulong)*(uint *)((long)in_RDI->fn + (ulong)in_ESI * 4 + 0x14);
  IVar2 = getcurrf((jit_State *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar8 = 0;
  iVar3 = rec_upvalue_constify(in_RDI,uvp_00);
  if (iVar3 != 0) {
    if (0x7fff < (IVar2 & 0xffff)) {
      if (0x5f < in_RDI->pt->flags) goto LAB_0014b5af;
      in_stack_ffffffffffffff44 =
           lj_ir_kgc((jit_State *)CONCAT44(IVar2,in_stack_ffffffffffffff50),
                     (GCobj *)CONCAT44(iVar8,in_stack_ffffffffffffff48),in_stack_ffffffffffffff44);
      (in_RDI->fold).ins.field_0.ot = 0x888;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)IVar2;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)in_stack_ffffffffffffff44;
      lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      in_RDI->base[-1] = in_stack_ffffffffffffff44 | 0x10000;
      IVar2 = in_stack_ffffffffffffff44;
    }
    TVar4 = lj_record_constify((jit_State *)CONCAT44(iVar8,in_stack_ffffffffffffff48),
                               (cTValue *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (TVar4 != 0) {
      return TVar4;
    }
  }
LAB_0014b5af:
  uVar6 = uvp_00->dhash + 0xfb3ee249;
  uVar7 = uVar6 * 0x4000 | uVar6 >> 0x12;
  iVar3 = (uVar6 ^ uvp_00->dhash) - uVar7;
  uVar1 = (ushort)(in_ESI << 8) |
          ((ushort)iVar3 ^ ((ushort)(uVar7 << 5) | (ushort)(uVar6 * 0x4000 >> 0x1b))) -
          (ushort)((uint)iVar3 >> 0x13) & 0xff;
  if (uvp_00->closed == '\0') {
    if ((((in_RDI->L->stack).ptr32 <= (uvp_00->v).ptr32) &&
        ((uvp_00->v).ptr32 < (in_RDI->L->maxstack).ptr32)) &&
       (iVar3 = (int)((long)((ulong)(uvp_00->v).ptr32 -
                            (long)(in_RDI->L->base + -(ulong)in_RDI->baseslot)) >> 3), -1 < iVar3))
    {
      iVar3 = iVar3 - in_RDI->baseslot;
      if (in_EDX != 0) {
        in_RDI->base[iVar3] = in_EDX;
        if ((int)in_RDI->maxslot <= iVar3) {
          in_RDI->maxslot = iVar3 + 1;
        }
        return 0;
      }
      if (in_RDI->base[iVar3] != 0) {
        return in_RDI->base[iVar3];
      }
      TVar4 = sload((jit_State *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
      return TVar4;
    }
    (in_RDI->fold).ins.field_0.ot = 0x3c85;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)IVar2;
    (in_RDI->fold).ins.field_0.op2 = uVar1;
    TVar4 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    IVar9 = (IRRef1)TVar4;
  }
  else {
    iVar8 = 1;
    (in_RDI->fold).ins.field_0.ot = 0x3d85;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)IVar2;
    (in_RDI->fold).ins.field_0.op2 = uVar1;
    TVar4 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    IVar9 = (IRRef1)TVar4;
  }
  if (in_EDX == 0) {
    uVar5 = (ulong)(uvp_00->v).ptr32;
    if (*(uint *)(uVar5 + 4) < 0xfffeffff) {
      local_4 = 0xe;
    }
    else if (*(int *)(uVar5 + 4) >> 0xf == -2) {
      local_4 = 3;
    }
    else {
      local_4 = *(uint *)(uVar5 + 4) ^ 0xffffffff;
    }
    (in_RDI->fold).ins.field_0.ot = (ushort)local_4 | 0x4280;
    (in_RDI->fold).ins.field_0.op1 = IVar9;
    (in_RDI->fold).ins.field_0.op2 = 0;
    local_8c = lj_opt_fold((jit_State *)CONCAT44(local_4,in_stack_ffffffffffffff38));
    if (local_4 < 3) {
      local_8c = local_4 * 0xffffff + 0x7fff;
    }
  }
  else {
    local_a0 = in_EDX;
    if ((in_EDX >> 0x18 & 0x1f) - 0xf < 5) {
      (in_RDI->fold).ins.field_0.ot = 0x550e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_EDX;
      (in_RDI->fold).ins.field_0.op2 = 0x1d3;
      local_a0 = lj_opt_fold((jit_State *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    (in_RDI->fold).ins.field_0.ot = (byte)(local_a0 >> 0x18) & 0x1f | 0x4900;
    (in_RDI->fold).ins.field_0.op1 = IVar9;
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_a0;
    lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if ((iVar8 != 0) && ((local_a0 >> 0x18 & 0x1f) - 4 < 9)) {
      (in_RDI->fold).ins.field_0.ot = 0x5300;
      (in_RDI->fold).ins.field_0.op1 = IVar9;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_a0;
      lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    in_RDI->needsnap = '\x01';
    local_8c = 0;
  }
  return local_8c;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lua_assert(val == 0);
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
      J->base[-1] = TREF_FRAME | kfunc;
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	/* NYI: add IR to guard that it's still aliasing the same slot. */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    uref = tref_ref(emitir(IRTG(IR_UREFO, IRT_P32), fn, uv));
  } else {
    needbarrier = 1;
    uref = tref_ref(emitir(IRTG(IR_UREFC, IRT_P32), fn, uv));
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}